

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peephole.cpp
# Opt level: O2

Module * mocker::runPeepholeOptimization(Module *__return_storage_ptr__,Module *module)

{
  _List_node_base *p_Var1;
  long lVar2;
  element_type *peVar3;
  size_type sVar4;
  __type _Var5;
  bool bVar6;
  mapped_type *pmVar7;
  shared_ptr<mocker::nasm::Register> *reg;
  _Alloc_hider _Var8;
  __off64_t *in_R8;
  size_t in_R9;
  _List_node_base *p_Var9;
  list<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_> *__offin;
  _List_node_base *p_Var10;
  shared_ptr<mocker::nasm::Register> rDest;
  shared_ptr<mocker::nasm::NumericConstant> lit;
  shared_ptr<mocker::nasm::BinaryInst> incDec;
  shared_ptr<mocker::nasm::Mov> p;
  shared_ptr<mocker::nasm::Register> dest;
  uint in_stack_ffffffffffffff28;
  __shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2> local_c8;
  __shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2> local_b0;
  key_type local_a0;
  __shared_ptr<mocker::nasm::Empty,_(__gnu_cxx::_Lock_policy)2> local_80;
  __shared_ptr<mocker::nasm::UnaryInst,_(__gnu_cxx::_Lock_policy)2> local_70;
  Module *local_60;
  _List_node_base *local_58;
  __shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  nasm::Module::Module(__return_storage_ptr__,module);
  local_60 = __return_storage_ptr__;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,".text",(allocator<char> *)&local_b0);
  pmVar7 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::nasm::Section>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::nasm::Section>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::nasm::Section>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::nasm::Section>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 *)&__return_storage_ptr__->sections,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  p_Var10 = (_List_node_base *)&pmVar7->lines;
  while (p_Var10 = (((_List_base<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_> *)
                    &p_Var10->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var10 != (_List_node_base *)&pmVar7->lines) {
    if (p_Var10[3]._M_next != (_List_node_base *)0x0) {
      std::dynamic_pointer_cast<mocker::nasm::BinaryInst,mocker::nasm::Inst>
                ((shared_ptr<mocker::nasm::Inst> *)&local_a0);
      if (((long *)local_a0._M_dataplus._M_p != (long *)0x0) &&
         (lVar2 = *(long *)(local_a0._M_dataplus._M_p + 8), 0xfffffffd < (int)lVar2 - 5U)) {
        std::dynamic_pointer_cast<mocker::nasm::NumericConstant,mocker::nasm::Addr>
                  ((shared_ptr<mocker::nasm::Addr> *)&local_b0);
        if ((local_b0._M_ptr != (element_type *)0x0) &&
           (((local_b0._M_ptr)->dest).
            super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x1)) {
          local_80._M_ptr._0_4_ = (int)lVar2 == 3 ^ 3;
          std::dynamic_pointer_cast<mocker::nasm::Register,mocker::nasm::Addr>
                    ((shared_ptr<mocker::nasm::Addr> *)&local_c8);
          std::
          make_shared<mocker::nasm::UnaryInst,mocker::nasm::UnaryInst::OpType,std::shared_ptr<mocker::nasm::Register>>
                    ((OpType *)&local_70,(shared_ptr<mocker::nasm::Register> *)&local_80);
          std::__shared_ptr<mocker::nasm::Inst,(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__shared_ptr<mocker::nasm::Inst,(__gnu_cxx::_Lock_policy)2> *)(p_Var10 + 3),
                     &local_70);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70._M_refcount);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c8._M_refcount);
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b0._M_refcount);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_a0._M_string_length);
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,".text",(allocator<char> *)&local_b0);
  pmVar7 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::nasm::Section>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::nasm::Section>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::nasm::Section>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::nasm::Section>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 *)&__return_storage_ptr__->sections,&local_a0);
  __offin = &pmVar7->lines;
  std::__cxx11::string::~string((string *)&local_a0);
  p_Var10 = (_List_node_base *)__offin;
  do {
    do {
      p_Var10 = (((_List_base<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_> *)
                 &p_Var10->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      if (p_Var10 == (_List_node_base *)__offin) {
        local_a0._M_dataplus._M_p = (pointer)&local_a0;
        local_a0.field_2._M_allocated_capacity = 0;
        p_Var10 = (__offin->
                  super__List_base<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_>)._M_impl
                  ._M_node.super__List_node_base._M_next;
        local_a0._M_string_length = (size_type)local_a0._M_dataplus._M_p;
        while (p_Var9 = p_Var10, p_Var9 != (_List_node_base *)__offin) {
          p_Var10 = p_Var9->_M_next;
          if (p_Var9[1]._M_prev == (_List_node_base *)0x0) {
            std::dynamic_pointer_cast<mocker::nasm::Empty,mocker::nasm::Inst>
                      ((shared_ptr<mocker::nasm::Inst> *)&local_b0);
            peVar3 = local_b0._M_ptr;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b0._M_refcount);
            if (peVar3 != (element_type *)0x0) {
              std::__cxx11::list<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_>::splice
                        ((list<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_> *)&local_a0,
                         (int)local_a0._M_dataplus._M_p,(__off64_t *)__offin,(int)p_Var9,in_R8,in_R9
                         ,in_stack_ffffffffffffff28);
            }
          }
        }
        std::__cxx11::_List_base<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_>::_M_clear
                  ((_List_base<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_> *)&local_a0)
        ;
        return local_60;
      }
    } while (p_Var10[3]._M_next == (_List_node_base *)0x0);
    std::dynamic_pointer_cast<mocker::nasm::Mov,mocker::nasm::Inst>
              ((shared_ptr<mocker::nasm::Inst> *)&local_b0);
    if (local_b0._M_ptr != (element_type *)0x0) {
      std::__shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2> *)&local_a0,
                 &((local_b0._M_ptr)->dest).
                  super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>);
      std::dynamic_pointer_cast<mocker::nasm::Register,mocker::nasm::Addr>
                ((shared_ptr<mocker::nasm::Addr> *)&local_70);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_a0._M_string_length);
      if (local_70._M_ptr != (element_type *)0x0) {
        std::__shared_ptr<mocker::nasm::Inst,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<mocker::nasm::Mov,void>
                  ((__shared_ptr<mocker::nasm::Inst,(__gnu_cxx::_Lock_policy)2> *)&local_c8,
                   &local_b0);
        nasm::getUsedRegs((vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                           *)&local_a0,(shared_ptr<mocker::nasm::Inst> *)&local_c8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c8._M_refcount);
        sVar4 = local_a0._M_string_length;
        _Var8._M_p = local_a0._M_dataplus._M_p;
        do {
          if (_Var8._M_p == (pointer)sVar4) {
            local_58 = (__offin->
                       super__List_base<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_>).
                       _M_impl._M_node.super__List_node_base._M_next;
            p_Var9 = p_Var10;
            goto LAB_0012b9ba;
          }
          _Var5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)(*(long *)_Var8._M_p + 8),
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&(local_70._M_ptr)->op);
          _Var8._M_p = _Var8._M_p + 0x10;
        } while (!_Var5);
LAB_0012bb5b:
        std::
        vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
        ::~vector((vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                   *)&local_a0);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70._M_refcount);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b0._M_refcount);
  } while( true );
LAB_0012b9ba:
  if ((p_Var9 == local_58) ||
     (p_Var1 = p_Var9->_M_prev, p_Var1[3]._M_next == (_List_node_base *)0x0)) goto LAB_0012bb5b;
  local_c8._M_ptr = (element_type *)0x0;
  local_c8._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::dynamic_pointer_cast<mocker::nasm::Mov,mocker::nasm::Inst>
            ((shared_ptr<mocker::nasm::Inst> *)&local_80);
  if (CONCAT44(local_80._M_ptr._4_4_,(uint)local_80._M_ptr) != 0) {
    std::__shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_40,
               (__shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2> *)
               (CONCAT44(local_80._M_ptr._4_4_,(uint)local_80._M_ptr) + 8));
    std::dynamic_pointer_cast<mocker::nasm::Register,mocker::nasm::Addr>
              ((shared_ptr<mocker::nasm::Addr> *)&local_50);
    std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&local_c8,&local_50);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80._M_refcount);
  std::dynamic_pointer_cast<mocker::nasm::UnaryInst,mocker::nasm::Inst>
            ((shared_ptr<mocker::nasm::Inst> *)&local_80);
  if (CONCAT44(local_80._M_ptr._4_4_,(uint)local_80._M_ptr) != 0) {
    std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&local_c8,
               (__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2> *)
               (CONCAT44(local_80._M_ptr._4_4_,(uint)local_80._M_ptr) + 0x10));
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80._M_refcount);
  std::dynamic_pointer_cast<mocker::nasm::BinaryInst,mocker::nasm::Inst>
            ((shared_ptr<mocker::nasm::Inst> *)&local_80);
  if (CONCAT44(local_80._M_ptr._4_4_,(uint)local_80._M_ptr) != 0) {
    std::dynamic_pointer_cast<mocker::nasm::Register,mocker::nasm::Addr>
              ((shared_ptr<mocker::nasm::Addr> *)&local_50);
    std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&local_c8,&local_50);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80._M_refcount);
  std::dynamic_pointer_cast<mocker::nasm::Lea,mocker::nasm::Inst>
            ((shared_ptr<mocker::nasm::Inst> *)&local_80);
  if (CONCAT44(local_80._M_ptr._4_4_,(uint)local_80._M_ptr) != 0) {
    std::dynamic_pointer_cast<mocker::nasm::Register,mocker::nasm::Register>
              ((shared_ptr<mocker::nasm::Register> *)&local_50);
    std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&local_c8,&local_50);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80._M_refcount);
  if ((local_c8._M_ptr == (element_type *)0x0) ||
     (bVar6 = std::operator!=(&(local_c8._M_ptr)->identifier,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &(local_70._M_ptr)->op), bVar6)) {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c8._M_refcount);
    goto LAB_0012bb5b;
  }
  std::make_shared<mocker::nasm::Empty>();
  std::__shared_ptr<mocker::nasm::Inst,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<mocker::nasm::Inst,(__gnu_cxx::_Lock_policy)2> *)(p_Var1 + 3),&local_80);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c8._M_refcount);
  p_Var9 = p_Var9->_M_prev;
  goto LAB_0012b9ba;
}

Assistant:

nasm::Module runPeepholeOptimization(const nasm::Module &module) {
  auto res = module;
  useIncDec(res);
  removeUnusedValue(res);
  return res;
}